

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

void EntityRelationTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  float *location;
  typed_option<float> *ptVar1;
  option_group_definition *poVar2;
  typed_option<unsigned_long> *op;
  example *peVar3;
  int i;
  int iVar4;
  long lVar5;
  option_group_definition new_options;
  wclass default_wclass;
  undefined1 *local_5d0 [2];
  undefined1 local_5c0 [16];
  string local_5b0;
  undefined1 *local_590 [2];
  undefined1 local_580 [16];
  string local_570;
  undefined1 *local_550 [2];
  undefined1 local_540 [16];
  string local_530;
  undefined1 *local_510 [2];
  undefined1 local_500 [16];
  string local_4f0;
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  string local_4b0;
  option_group_definition local_490;
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  string local_438;
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  typed_option<float> local_3f8;
  undefined1 local_350 [112];
  bool local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  location = (float *)operator_new(0x70);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  location[3] = 0.0;
  location[4] = 0.0;
  location[5] = 0.0;
  location[6] = 0.0;
  location[7] = 0.0;
  location[8] = 0.0;
  location[9] = 0.0;
  location[10] = 0.0;
  location[0xb] = 0.0;
  location[0xc] = 0.0;
  location[0xd] = 0.0;
  location[0xe] = 0.0;
  location[0xf] = 0.0;
  location[0x10] = 0.0;
  location[0x11] = 0.0;
  location[0x12] = 0.0;
  location[0x13] = 0.0;
  location[0x14] = 0.0;
  location[0x15] = 0.0;
  location[0x16] = 0.0;
  location[0x17] = 0.0;
  location[0x18] = 0.0;
  location[0x19] = 0.0;
  location[0x1a] = 0.0;
  location[0x1b] = 0.0;
  sch->task_data = location;
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Entity Relation Options","")
  ;
  local_490.m_name._M_dataplus._M_p = (pointer)&local_490.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_490,local_418,local_418 + local_410);
  local_490.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_490.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_490.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"relation_cost","");
  VW::config::typed_option<float>::typed_option(&local_3f8,&local_4b0,location + 2);
  local_3f8.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_3f8,1.0);
  local_4d0[0] = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Relation Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (&local_490,ptVar1);
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"entity_cost","");
  VW::config::typed_option<float>::typed_option(&local_d0,&local_4f0,location + 1);
  local_d0.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"Entity Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar1)
  ;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"constraints","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_530,(bool *)(location + 4));
  local_2e0 = true;
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"Use Constraints","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_350);
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"relation_none_cost","");
  VW::config::typed_option<float>::typed_option(&local_170,&local_570,location);
  local_170.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_170,0.5);
  local_590[0] = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"None Relation Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar1)
  ;
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"skip_cost","");
  VW::config::typed_option<float>::typed_option(&local_210,&local_5b0,location + 3);
  local_210.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_210,0.01);
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d0,"Skip Cost (only used when search_order = skip","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar1)
  ;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"search_order","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,&local_438,(unsigned_long *)(location + 0x16));
  local_2b0.super_base_option.m_keep = true;
  op = VW::config::typed_option<unsigned_long>::default_value(&local_2b0,0);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,"Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)",""
            );
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(poVar2,op);
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da208;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  if (local_5d0[0] != local_5c0) {
    operator_delete(local_5d0[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da240;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  if (local_590[0] != local_580) {
    operator_delete(local_590[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da240;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if (local_550[0] != local_540) {
    operator_delete(local_550[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002da130;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p);
  }
  if (local_510[0] != local_500) {
    operator_delete(local_510[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da240;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  if (local_4d0[0] != local_4c0) {
    operator_delete(local_4d0[0]);
  }
  local_3f8.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da240;
  if (local_3f8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f8.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_490);
  iVar4 = 1;
  do {
    local_3f8.super_base_option._vptr_base_option =
         (_func_int **)CONCAT44(local_3f8.super_base_option._vptr_base_option._4_4_,iVar4);
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(location + 6),(uint *)&local_3f8);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 5);
  iVar4 = 5;
  do {
    local_3f8.super_base_option._vptr_base_option =
         (_func_int **)CONCAT44(local_3f8.super_base_option._vptr_base_option._4_4_,iVar4);
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(location + 0xe),(uint *)&local_3f8);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0xb);
  *(undefined1 *)((long)location + 0x11) = 0;
  if (*(long *)(location + 0x16) - 3U < 2) {
    peVar3 = VW::alloc_examples(0x20,10);
    local_3f8.super_base_option._vptr_base_option = (_func_int **)0x0;
    local_3f8.super_base_option.m_name._M_dataplus._M_p = (pointer)0x0;
    lVar5 = 0x6828;
    do {
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 ((long)(peVar3->super_example_predict).feature_space + lVar5 + -0x20),
                 (wclass *)&local_3f8);
      lVar5 = lVar5 + 0x68d0;
    } while (lVar5 != 0x48048);
    *(example **)(location + 0x18) = peVar3;
    *(example **)(location + 0x1a) = peVar3 + 4;
    Search::search::set_options(sch,Search::IS_LDF);
  }
  else {
    Search::search::set_options(sch,0);
  }
  Search::search::set_num_learners(sch,2);
  if (*(unsigned_long *)(location + 0x16) == 4) {
    Search::search::set_num_learners(sch,3);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_490.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
    operator_delete(local_490.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* my_task_data = new task_data();
  sch.set_task_data<task_data>(my_task_data);

  option_group_definition new_options("Entity Relation Options");
  new_options
      .add(make_option("relation_cost", my_task_data->relation_cost).keep().default_value(1.f).help("Relation Cost"))
      .add(make_option("entity_cost", my_task_data->entity_cost).keep().default_value(1.f).help("Entity Cost"))
      .add(make_option("constraints", my_task_data->constraints).keep().help("Use Constraints"))
      .add(make_option("relation_none_cost", my_task_data->relation_none_cost)
               .keep()
               .default_value(0.5f)
               .help("None Relation Cost"))
      .add(make_option("skip_cost", my_task_data->skip_cost)
               .keep()
               .default_value(0.01f)
               .help("Skip Cost (only used when search_order = skip"))
      .add(make_option("search_order", my_task_data->search_order)
               .keep()
               .default_value(0)
               .help("Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)"));
  options.add_and_parse(new_options);

  // setup entity and relation labels
  // Entity label 1:E_Other 2:E_Peop 3:E_Org 4:E_Loc
  // Relation label 5:R_Live_in 6:R_OrgBased_in 7:R_Located_in 8:R_Work_For 9:R_Kill 10:R_None
  for (int i = 1; i < 5; i++) my_task_data->y_allowed_entity.push_back(i);

  for (int i = 5; i < 11; i++) my_task_data->y_allowed_relation.push_back(i);

  my_task_data->allow_skip = false;

  if (my_task_data->search_order != 3 && my_task_data->search_order != 4)
  {
    sch.set_options(0);
  }
  else
  {
    example* ldf_examples = VW::alloc_examples(sizeof(CS::label), 10);
    CS::wclass default_wclass = {0., 0, 0., 0.};
    for (size_t a = 0; a < 10; a++)
    {
      ldf_examples[a].l.cs.costs.push_back(default_wclass);
    }
    my_task_data->ldf_entity = ldf_examples;
    my_task_data->ldf_relation = ldf_examples + 4;
    sch.set_options(Search::IS_LDF);
  }

  sch.set_num_learners(2);
  if (my_task_data->search_order == 4)
    sch.set_num_learners(3);
}